

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

int Llb_ManReachability(Llb_Man_t *p,Vec_Int_t *vHints,DdManager **pddGlo)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *Permute;
  int *Permute_00;
  int *Permute_01;
  abctime aVar5;
  abctime aVar6;
  DdManager *pDVar7;
  DdNode *pDVar8;
  DdNode *n;
  abctime aVar9;
  DdNode *pDVar10;
  Abc_Cex_t *pAVar11;
  Llb_Grp_t *pGroup;
  DdNode *pDVar12;
  double dVar13;
  double dVar14;
  long local_a0;
  double nMints;
  int nBddSize;
  int nIters;
  abctime clk;
  abctime clk2;
  DdNode *bConstrNs;
  DdNode *bConstrCs;
  DdNode *bCube;
  DdNode *bTemp;
  DdNode *bNext;
  DdNode *bReached;
  DdNode *bCurrent;
  int *pGlo2Cs;
  int *pCs2Glo;
  int *pNs2Glo;
  DdManager **pddGlo_local;
  Vec_Int_t *vHints_local;
  Llb_Man_t *p_local;
  
  Permute = Vec_IntArray(p->vNs2Glo);
  Permute_00 = Vec_IntArray(p->vCs2Glo);
  Permute_01 = Vec_IntArray(p->vGlo2Cs);
  aVar5 = Abc_Clock();
  nMints._0_4_ = 0;
  if (p->pPars->TimeLimit == 0) {
    local_a0 = 0;
  }
  else {
    iVar3 = p->pPars->TimeLimit;
    aVar6 = Abc_Clock();
    local_a0 = (long)iVar3 * 1000000 + aVar6;
  }
  p->pPars->TimeTarget = local_a0;
  Llb_ManPrepareVarLimits(p);
  if (p->dd != (DdManager *)0x0) {
    __assert_fail("p->dd == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,600,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  if (p->ddG != (DdManager *)0x0) {
    __assert_fail("p->ddG == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x259,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  if (p->ddR != (DdManager *)0x0) {
    __assert_fail("p->ddR == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x25a,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  uVar2 = Vec_IntSize(p->vVar2Obj);
  pDVar7 = Cudd_Init(uVar2,0,0x100,0x40000,0);
  p->dd = pDVar7;
  uVar2 = Aig_ManCiNum(p->pAig);
  pDVar7 = Cudd_Init(uVar2,0,0x100,0x40000,0);
  p->ddR = pDVar7;
  if ((pddGlo == (DdManager **)0x0) || (*pddGlo == (DdManager *)0x0)) {
    uVar2 = Aig_ManRegNum(p->pAig);
    pDVar7 = Cudd_Init(uVar2,0,0x100,0x40000,0);
    p->ddG = pDVar7;
  }
  else {
    p->ddG = *pddGlo;
    *pddGlo = (DdManager *)0x0;
  }
  if (p->pPars->fReorder == 0) {
    Cudd_AutodynDisable(p->dd);
    Cudd_AutodynDisable(p->ddG);
    Cudd_AutodynDisable(p->ddR);
  }
  else {
    Cudd_AutodynEnable(p->dd,CUDD_REORDER_SYMM_SIFT);
    Cudd_AutodynEnable(p->ddG,CUDD_REORDER_SYMM_SIFT);
    Cudd_AutodynEnable(p->ddR,CUDD_REORDER_SYMM_SIFT);
  }
  p->dd->TimeStop = p->pPars->TimeTarget;
  p->ddG->TimeStop = p->pPars->TimeTarget;
  p->ddR->TimeStop = p->pPars->TimeTarget;
  pDVar8 = Llb_BddComputeBad(p->pAigGlo,p->ddR,p->pPars->TimeTarget);
  p->ddR->bFunc = pDVar8;
  if (p->ddR->bFunc == (DdNode *)0x0) {
    if (p->pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) during constructing the bad states.\n",
             (ulong)(uint)p->pPars->TimeLimit);
    }
    p->pPars->iFrame = -1;
    p_local._4_4_ = -1;
  }
  else {
    Cudd_Ref(p->ddR->bFunc);
    pDVar8 = Llb_ManCreateConstraints(p,vHints,0);
    Cudd_Ref(pDVar8);
    n = Llb_ManCreateConstraints(p,vHints,1);
    Cudd_Ref(n);
    if (p->ddG->bFunc == (DdNode *)0x0) {
      bNext = Llb_ManComputeInitState(p,p->ddG);
      Cudd_Ref(bNext);
      bReached = Llb_ManComputeInitState(p,p->dd);
      Cudd_Ref(bReached);
    }
    else {
      bNext = p->ddG->bFunc;
      p->ddG->bFunc = (DdNode *)0x0;
      bReached = Extra_TransferPermute(p->ddG,p->dd,bNext,Permute_01);
      Cudd_Ref(bReached);
    }
    for (nMints._4_4_ = 0; (int)nMints._4_4_ < p->pPars->nIterMax; nMints._4_4_ = nMints._4_4_ + 1)
    {
      aVar6 = Abc_Clock();
      if ((p->pPars->TimeLimit != 0) && (aVar9 = Abc_Clock(), p->pPars->TimeTarget < aVar9)) {
        if (p->pPars->fSilent == 0) {
          printf("Reached timeout during image computation (%d seconds).\n",
                 (ulong)(uint)p->pPars->TimeLimit);
        }
        p->pPars->iFrame = nMints._4_4_ - 1;
        Cudd_RecursiveDeref(p->dd,bReached);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        Cudd_RecursiveDeref(p->dd,n);
        Cudd_RecursiveDeref(p->ddG,bNext);
        return -1;
      }
      pDVar10 = Extra_TransferPermute(p->dd,p->ddR,bReached,Permute_00);
      if (pDVar10 == (DdNode *)0x0) {
        if (p->pPars->fSilent == 0) {
          printf("Reached timeout (%d seconds) during ring transfer.\n",
                 (ulong)(uint)p->pPars->TimeLimit);
        }
        p->pPars->iFrame = nMints._4_4_ - 1;
        Cudd_RecursiveDeref(p->dd,bReached);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        Cudd_RecursiveDeref(p->dd,n);
        Cudd_RecursiveDeref(p->ddG,bNext);
        return -1;
      }
      Cudd_Ref(pDVar10);
      Vec_PtrPush(p->vRings,pDVar10);
      if ((p->pPars->fSkipOutCheck == 0) &&
         (iVar3 = Cudd_bddLeq(p->ddR,pDVar10,(DdNode *)((ulong)p->ddR->bFunc ^ 1)), iVar3 == 0)) {
        if (p->pAigGlo->pSeqModel == (Abc_Cex_t *)0x0) {
          if (p->pPars->fBackward == 0) {
            pAVar11 = Llb_ManReachDeriveCex(p);
            p->pAigGlo->pSeqModel = pAVar11;
          }
          if (p->pPars->fSilent == 0) {
            if (p->pPars->fBackward == 0) {
              Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                        (ulong)(uint)p->pAigGlo->pSeqModel->iPo,p->pAigGlo->pName,p->pAigGlo->pName,
                        (ulong)nMints._4_4_);
            }
            else {
              Abc_Print(1,
                        "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  "
                        ,p->pAigGlo->pName,(ulong)nMints._4_4_);
            }
            aVar6 = Abc_Clock();
            Abc_PrintTime(1,"Time",aVar6 - aVar5);
          }
          p->pPars->iFrame = nMints._4_4_ - 1;
          Cudd_RecursiveDeref(p->dd,bReached);
          Cudd_RecursiveDeref(p->dd,pDVar8);
          Cudd_RecursiveDeref(p->dd,n);
          Cudd_RecursiveDeref(p->ddG,bNext);
          return 0;
        }
        __assert_fail("p->pAigGlo->pSeqModel == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                      ,0x2b8,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
      }
      if (vHints != (Vec_Int_t *)0x0) {
        pDVar10 = Cudd_bddAnd(p->dd,bReached,pDVar8);
        Cudd_Ref(pDVar10);
        Cudd_RecursiveDeref(p->dd,bReached);
        bReached = pDVar10;
      }
      pGroup = (Llb_Grp_t *)Vec_PtrEntry(p->vGroups,0);
      pDVar10 = Llb_ManConstructQuantCubeIntern(p,pGroup,0,0);
      Cudd_Ref(pDVar10);
      pDVar12 = Cudd_bddExistAbstract(p->dd,bReached,pDVar10);
      Cudd_Ref(pDVar12);
      Cudd_RecursiveDeref(p->dd,bReached);
      Cudd_RecursiveDeref(p->dd,pDVar10);
      pDVar10 = Llb_ManComputeImage(p,pDVar12,0);
      if (pDVar10 == (DdNode *)0x0) {
        if (p->pPars->fSilent == 0) {
          printf("Reached timeout (%d seconds) during image computation.\n",
                 (ulong)(uint)p->pPars->TimeLimit);
        }
        p->pPars->iFrame = nMints._4_4_ - 1;
        Cudd_RecursiveDeref(p->dd,pDVar12);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        Cudd_RecursiveDeref(p->dd,n);
        Cudd_RecursiveDeref(p->ddG,bNext);
        return -1;
      }
      Cudd_Ref(pDVar10);
      Cudd_RecursiveDeref(p->dd,pDVar12);
      bReached = (DdNode *)0x0;
      bTemp = pDVar10;
      if (vHints != (Vec_Int_t *)0x0) {
        bTemp = Cudd_bddAnd(p->dd,pDVar10,n);
        Cudd_Ref(bTemp);
        Cudd_RecursiveDeref(p->dd,pDVar10);
      }
      pDVar10 = Extra_TransferPermute(p->dd,p->ddG,bTemp,Permute);
      if (pDVar10 == (DdNode *)0x0) {
        if (p->pPars->fSilent == 0) {
          printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                 (ulong)(uint)p->pPars->TimeLimit);
        }
        p->pPars->iFrame = nMints._4_4_ - 1;
        Cudd_RecursiveDeref(p->dd,bTemp);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        Cudd_RecursiveDeref(p->dd,n);
        Cudd_RecursiveDeref(p->ddG,bNext);
        return -1;
      }
      Cudd_Ref(pDVar10);
      Cudd_RecursiveDeref(p->dd,bTemp);
      iVar3 = Cudd_bddLeq(p->ddG,pDVar10,bNext);
      if (iVar3 != 0) {
        Cudd_RecursiveDeref(p->ddG,pDVar10);
        break;
      }
      nMints._0_4_ = Cudd_DagSize(pDVar10);
      if (p->pPars->nBddMax < (int)nMints._0_4_) {
        Cudd_RecursiveDeref(p->ddG,pDVar10);
        break;
      }
      pDVar12 = Cudd_bddAnd(p->ddG,pDVar10,(DdNode *)((ulong)bNext ^ 1));
      if (pDVar12 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->ddG,pDVar10);
        Cudd_RecursiveDeref(p->ddG,bNext);
        bNext = (DdNode *)0x0;
        bReached = (DdNode *)0x0;
        break;
      }
      Cudd_Ref(pDVar12);
      bReached = Extra_TransferPermute(p->ddG,p->dd,pDVar12,Permute_01);
      if (bReached == (DdNode *)0x0) {
        if (p->pPars->fSilent == 0) {
          printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                 (ulong)(uint)p->pPars->TimeLimit);
        }
        p->pPars->iFrame = nMints._4_4_ - 1;
        Cudd_RecursiveDeref(p->ddG,pDVar12);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        Cudd_RecursiveDeref(p->dd,n);
        Cudd_RecursiveDeref(p->ddG,bNext);
        return -1;
      }
      Cudd_Ref(bReached);
      Cudd_RecursiveDeref(p->ddG,pDVar12);
      pDVar12 = Cudd_bddOr(p->ddG,bNext,pDVar10);
      if (pDVar12 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->ddG,bNext);
        Cudd_RecursiveDeref(p->ddG,pDVar10);
        bNext = pDVar12;
        break;
      }
      Cudd_Ref(pDVar12);
      Cudd_RecursiveDeref(p->ddG,bNext);
      Cudd_RecursiveDeref(p->ddG,pDVar10);
      if (p->pPars->fVerbose != 0) {
        fprintf(_stdout,"F =%5d : ",(ulong)nMints._4_4_);
        fprintf(_stdout,"Im =%6d  ",(ulong)nMints._0_4_);
        pFVar1 = _stdout;
        uVar2 = Cudd_ReadReorderings(p->dd);
        uVar4 = Cudd_ReadGarbageCollections(p->dd);
        fprintf(pFVar1,"(%4d %3d)   ",(ulong)uVar2,(ulong)uVar4);
        pFVar1 = _stdout;
        uVar2 = Cudd_DagSize(pDVar12);
        fprintf(pFVar1,"Rea =%6d  ",(ulong)uVar2);
        pFVar1 = _stdout;
        uVar2 = Cudd_ReadReorderings(p->ddG);
        uVar4 = Cudd_ReadGarbageCollections(p->ddG);
        fprintf(pFVar1,"(%4d%4d)   ",(ulong)uVar2,(ulong)uVar4);
        aVar9 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar9 - aVar6);
      }
      bNext = pDVar12;
    }
    Cudd_RecursiveDeref(p->dd,pDVar8);
    Cudd_RecursiveDeref(p->dd,n);
    if (bNext == (DdNode *)0x0) {
      p->pPars->iFrame = nMints._4_4_ - 1;
      p_local._4_4_ = 0;
    }
    else {
      if (bReached != (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->dd,bReached);
      }
      if (p->pPars->fVerbose != 0) {
        pDVar7 = p->ddG;
        iVar3 = Saig_ManRegNum(p->pAig);
        dVar13 = Cudd_CountMinterm(pDVar7,bNext,iVar3);
        if (((int)nMints._4_4_ < p->pPars->nIterMax) && ((int)nMints._0_4_ <= p->pPars->nBddMax)) {
          fprintf(_stdout,"Reachability analysis completed after %d frames.\n",(ulong)nMints._4_4_);
        }
        else {
          fprintf(_stdout,"Reachability analysis is stopped after %d frames.\n",(ulong)nMints._4_4_)
          ;
        }
        pFVar1 = _stdout;
        iVar3 = Saig_ManRegNum(p->pAig);
        dVar14 = pow(2.0,(double)iVar3);
        fprintf(pFVar1,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar13,
                (dVar13 * 100.0) / dVar14);
        fflush(_stdout);
      }
      if (((int)nMints._4_4_ < p->pPars->nIterMax) && ((int)nMints._0_4_ <= p->pPars->nBddMax)) {
        if (pddGlo == (DdManager **)0x0) {
          Cudd_RecursiveDeref(p->ddG,bNext);
        }
        else {
          if (p->ddG->bFunc != (DdNode *)0x0) {
            __assert_fail("p->ddG->bFunc == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                          ,0x375,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
          }
          p->ddG->bFunc = bNext;
          if (*pddGlo != (DdManager *)0x0) {
            __assert_fail("*pddGlo == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                          ,0x377,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
          }
          *pddGlo = p->ddG;
          p->ddG = (DdManager *)0x0;
        }
        if (p->pPars->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",(ulong)nMints._4_4_);
        }
        p->pPars->iFrame = nMints._4_4_ - 1;
        p_local._4_4_ = 1;
      }
      else {
        if (p->pPars->fSilent == 0) {
          printf("Verified only for states reachable in %d frames.  ",(ulong)nMints._4_4_);
        }
        p->pPars->iFrame = p->pPars->nIterMax;
        Cudd_RecursiveDeref(p->ddG,bNext);
        p_local._4_4_ = -1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Llb_ManReachability( Llb_Man_t * p, Vec_Int_t * vHints, DdManager ** pddGlo )
{
    int * pNs2Glo = Vec_IntArray( p->vNs2Glo );
    int * pCs2Glo = Vec_IntArray( p->vCs2Glo );
    int * pGlo2Cs = Vec_IntArray( p->vGlo2Cs );
    DdNode * bCurrent, * bReached, * bNext, * bTemp, * bCube;
    DdNode * bConstrCs, * bConstrNs;
    abctime clk2, clk = Abc_Clock();
    int nIters, nBddSize = 0;
//    int nThreshold = 10000;

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    // define variable limits
    Llb_ManPrepareVarLimits( p );

    // start the managers
    assert( p->dd == NULL );
    assert( p->ddG == NULL );
    assert( p->ddR == NULL );
    p->dd  = Cudd_Init( Vec_IntSize(p->vVar2Obj), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR = Cudd_Init( Aig_ManCiNum(p->pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    if ( pddGlo && *pddGlo )
        p->ddG = *pddGlo, *pddGlo = NULL; 
    else
        p->ddG = Cudd_Init( Aig_ManRegNum(p->pAig),   0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    if ( p->pPars->fReorder )
    {
        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
        Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    }
    else
    {
        Cudd_AutodynDisable( p->dd );
        Cudd_AutodynDisable( p->ddG );
        Cudd_AutodynDisable( p->ddR );
    }

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // create bad state in the ring manager
    p->ddR->bFunc  = Llb_BddComputeBad( p->pAigGlo, p->ddR, p->pPars->TimeTarget );          
    if ( p->ddR->bFunc == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    Cudd_Ref( p->ddR->bFunc );

    // derive constraints
    bConstrCs = Llb_ManCreateConstraints( p, vHints, 0 );   Cudd_Ref( bConstrCs );
    bConstrNs = Llb_ManCreateConstraints( p, vHints, 1 );   Cudd_Ref( bConstrNs );
//Extra_bddPrint( p->dd, bConstrCs ); printf( "\n" );
//Extra_bddPrint( p->dd, bConstrNs ); printf( "\n" );

    // perform reachability analysis
    // compute the starting set of states
    if ( p->ddG->bFunc )
    {
        bReached = p->ddG->bFunc; p->ddG->bFunc = NULL;
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bReached, pGlo2Cs );    Cudd_Ref( bCurrent );
    }
    else
    {
        bReached = Llb_ManComputeInitState( p, p->ddG );                         Cudd_Ref( bReached );
        bCurrent = Llb_ManComputeInitState( p, p->dd  );                         Cudd_Ref( bCurrent );
    }
//Extra_bddPrintSupport( p->ddG, bReached ); printf( "\n" );
//Extra_bddPrintSupport( p->dd,  bCurrent ); printf( "\n" );

//Extra_bddPrintSupport( p->dd, bCurrent ); printf( "\n" );
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clk2 = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout during image computation (%d seconds).\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, bCurrent, pCs2Glo );
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during ring transfer.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pAigGlo->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pAigGlo->pSeqModel = Llb_ManReachDeriveCex( p ); 
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pAigGlo->pSeqModel->iPo, p->pAigGlo->pName, p->pAigGlo->pName, nIters );
                else
                    Abc_Print( 1, "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  ", p->pAigGlo->pName, nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return 0; 
        }

        // restrict reachable states using constraints
        if ( vHints )
        {
            bCurrent = Cudd_bddAnd( p->dd, bTemp = bCurrent, bConstrCs );                                Cudd_Ref( bCurrent );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }

        // quantify variables appearing only in the init state
        bCube    = Llb_ManConstructQuantCubeIntern( p, (Llb_Grp_t *)Vec_PtrEntry(p->vGroups,0), 0, 0 );  Cudd_Ref( bCube );
        bCurrent = Cudd_bddExistAbstract( p->dd, bTemp = bCurrent, bCube );                              Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );

        // compute the next states
        bNext = Llb_ManComputeImage( p, bCurrent, 0 );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );   bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bCurrent ); bCurrent = NULL;

        // restrict reachable states using constraints
        if ( vHints )
        {
            bNext = Cudd_bddAnd( p->dd, bTemp = bNext, bConstrNs );                Cudd_Ref( bNext );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }
//Extra_bddPrintSupport( p->dd, bNext ); printf( "\n" );

        // remap these states into the current state vars
//        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pNs2Glo );    Cudd_Ref( bNext );
//        Cudd_RecursiveDeref( p->dd, bTemp );
//        bNext = Extra_TransferPermuteTime( p->dd, p->ddG, bTemp = bNext, pNs2Glo, p->pPars->TimeTarget );    
        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pNs2Glo );    
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bTemp );  
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bTemp );  


        // check if there are any new states
        if ( Cudd_bddLeq( p->ddG, bNext, bReached ) ) // implication = no new states
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // check the BDD size
        nBddSize = Cudd_DagSize(bNext);
        if ( nBddSize > p->pPars->nBddMax )
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // get the new states
        bCurrent = Cudd_bddAnd( p->ddG, bNext, Cudd_Not(bReached) );
        if ( bCurrent == NULL )
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );        bNext = NULL;
            Cudd_RecursiveDeref( p->ddG,  bReached );     bReached = NULL;
            break;
        }
        Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( p->ddG, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        bCurrent = Cudd_bddRestrict( p->ddG, bTemp = bCurrent, Cudd_Not(bReached) );  Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );
//printf( "Initial BDD =%7d. Constrained BDD =%7d.\n", Cudd_DagSize(bTemp), Cudd_DagSize(bCurrent) );

        // remap these states into the current state vars
//        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs );   Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );
//        bCurrent = Extra_TransferPermuteTime( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs, p->pPars->TimeTarget );    
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs );    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddG, bTemp ); 
        

        // add to the reached states
        bReached = Cudd_bddOr( p->ddG, bTemp = bReached, bNext );                       
        if ( bReached == NULL )
        {
            Cudd_RecursiveDeref( p->ddG,  bTemp );     bTemp = NULL;
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }
        Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        Cudd_RecursiveDeref( p->ddG, bNext );
        bNext = NULL;

        if ( p->pPars->fVerbose )
        {
            fprintf( stdout, "F =%5d : ",    nIters );
            fprintf( stdout, "Im =%6d  ",    nBddSize );
            fprintf( stdout, "(%4d %3d)   ", Cudd_ReadReorderings(p->dd),  Cudd_ReadGarbageCollections(p->dd) );
            fprintf( stdout, "Rea =%6d  ",   Cudd_DagSize(bReached) );
            fprintf( stdout, "(%4d%4d)   ",  Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
/*
        if ( p->pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->ddG, bReached );printf( "\n" );
            fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
*/
    }
    Cudd_RecursiveDeref( p->dd, bConstrCs ); bConstrCs = NULL;
    Cudd_RecursiveDeref( p->dd, bConstrNs ); bConstrNs = NULL;
    if ( bReached == NULL )
    {
        p->pPars->iFrame = nIters - 1;
        return 0; // reachable
    }
//    assert( bCurrent == NULL );
    if ( bCurrent )
        Cudd_RecursiveDeref( p->dd, bCurrent );
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        Cudd_RecursiveDeref( p->ddG, bReached );
        return -1; // undecided
    }
    if ( pddGlo ) 
    {
        assert( p->ddG->bFunc == NULL );
        p->ddG->bFunc = bReached; bReached = NULL;
        assert( *pddGlo == NULL );
        *pddGlo = p->ddG;  p->ddG = NULL;
    }
    else
        Cudd_RecursiveDeref( p->ddG, bReached );
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}